

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall libcellml::Analyser::AnalyserImpl::AnalyserImpl(AnalyserImpl *this)

{
  element_type *peVar1;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  shared_ptr<libcellml::Model> local_20;
  AnalyserImpl *local_10;
  AnalyserImpl *this_local;
  
  local_10 = this;
  Logger::LoggerImpl::LoggerImpl(&this->super_LoggerImpl);
  this->mAnalyser = (Analyser *)0x0;
  std::shared_ptr<libcellml::Model>::shared_ptr(&local_20,(nullptr_t)0x0);
  AnalyserModel::AnalyserModelImpl::create((AnalyserModelImpl *)&this->mModel,&local_20);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_20);
  std::
  vector<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ::vector(&this->mExternalVariables);
  std::
  vector<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ::vector(&this->mInternalVariables);
  std::
  vector<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ::vector(&this->mInternalEquations);
  GeneratorProfile::create((GeneratorProfile *)&this->mGeneratorProfile,C);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Units>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Units>_>_>_>
  ::map(&this->mStandardUnits);
  std::
  map<std::shared_ptr<libcellml::AnalyserEquationAst>,_std::shared_ptr<libcellml::Units>,_std::less<std::shared_ptr<libcellml::AnalyserEquationAst>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::AnalyserEquationAst>,_std::shared_ptr<libcellml::Units>_>_>_>
  ::map(&this->mCiCnUnits);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"abs",&local_51);
  GeneratorProfile::setAbsoluteValueString(peVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ln",&local_79);
  GeneratorProfile::setNaturalLogarithmString(peVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"log",&local_a1);
  GeneratorProfile::setCommonLogarithmString(peVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"rem",&local_c9);
  GeneratorProfile::setRemString(peVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"arcsin",&local_f1);
  GeneratorProfile::setAsinString(peVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"arccos",&local_119);
  GeneratorProfile::setAcosString(peVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"arctan",&local_141);
  GeneratorProfile::setAtanString(peVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"arcsec",&local_169);
  GeneratorProfile::setAsecString(peVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"arccsc",&local_191);
  GeneratorProfile::setAcscString(peVar1,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"arccot",&local_1b9);
  GeneratorProfile::setAcotString(peVar1,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"arcsinh",&local_1e1);
  GeneratorProfile::setAsinhString(peVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"arccosh",&local_209);
  GeneratorProfile::setAcoshString(peVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"arctanh",&local_231);
  GeneratorProfile::setAtanhString(peVar1,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"arcsech",&local_259);
  GeneratorProfile::setAsechString(peVar1,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"arccsch",&local_281);
  GeneratorProfile::setAcschString(peVar1,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"arccoth",&local_2a9);
  GeneratorProfile::setAcothString(peVar1,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"true",&local_2d1);
  GeneratorProfile::setTrueString(peVar1,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"false",&local_2f9);
  GeneratorProfile::setFalseString(peVar1,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"exponentiale",&local_321)
  ;
  GeneratorProfile::setEString(peVar1,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"pi",&local_349);
  GeneratorProfile::setPiString(peVar1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"infinity",&local_371);
  GeneratorProfile::setInfString(peVar1,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  peVar1 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mGeneratorProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"notanumber",&local_399);
  GeneratorProfile::setNanString(peVar1,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  return;
}

Assistant:

Analyser::AnalyserImpl::AnalyserImpl()
{
    // Customise our generator's profile.

    mGeneratorProfile->setAbsoluteValueString("abs");
    mGeneratorProfile->setNaturalLogarithmString("ln");
    mGeneratorProfile->setCommonLogarithmString("log");
    mGeneratorProfile->setRemString("rem");
    mGeneratorProfile->setAsinString("arcsin");
    mGeneratorProfile->setAcosString("arccos");
    mGeneratorProfile->setAtanString("arctan");
    mGeneratorProfile->setAsecString("arcsec");
    mGeneratorProfile->setAcscString("arccsc");
    mGeneratorProfile->setAcotString("arccot");
    mGeneratorProfile->setAsinhString("arcsinh");
    mGeneratorProfile->setAcoshString("arccosh");
    mGeneratorProfile->setAtanhString("arctanh");
    mGeneratorProfile->setAsechString("arcsech");
    mGeneratorProfile->setAcschString("arccsch");
    mGeneratorProfile->setAcothString("arccoth");
    mGeneratorProfile->setTrueString("true");
    mGeneratorProfile->setFalseString("false");
    mGeneratorProfile->setEString("exponentiale");
    mGeneratorProfile->setPiString("pi");
    mGeneratorProfile->setInfString("infinity");
    mGeneratorProfile->setNanString("notanumber");
}